

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::init(arg_map<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  undefined1 auVar2 [16];
  value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  val;
  value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  val_00;
  bool bVar3;
  size_type sVar4;
  type tVar5;
  ulong uVar6;
  ulong uVar7;
  entry *peVar8;
  undefined8 *puVar9;
  uint i_1;
  type arg_type;
  uint i;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffff80;
  entry *peVar10;
  entry *local_78;
  arg_map<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  uint local_3c;
  uint local_20;
  
  if (this->map_ == (entry *)0x0) {
    sVar4 = basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
            ::max_size(in_stack_ffffffffffffff80);
    uVar6 = CONCAT44(0,sVar4);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    uVar7 = SUB168(auVar2 * ZEXT816(0x30),0);
    if (SUB168(auVar2 * ZEXT816(0x30),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    peVar8 = (entry *)operator_new__(uVar7);
    if (uVar6 != 0) {
      peVar10 = peVar8 + uVar6;
      local_78 = peVar8;
      do {
        entry::entry((entry *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        local_78 = local_78 + 1;
      } while (local_78 != peVar10);
    }
    this->map_ = peVar8;
    bVar3 = basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
            ::is_packed((basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                         *)ctx);
    if (bVar3) {
      local_20 = 0;
      while( true ) {
        tVar5 = basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                ::type((basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                        *)ctx,local_20);
        this = (arg_map<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                *)(ulong)tVar5;
        if (tVar5 == none_type) break;
        if (tVar5 == named_arg_type) {
          val.field_0.string.size = in_stack_ffffffffffffffb8;
          val.field_0.long_long_value = in_stack_ffffffffffffffb0;
          push_back(in_stack_ffffffffffffffa8,val);
        }
        local_20 = local_20 + 1;
      }
    }
    else {
      local_3c = 0;
      while( true ) {
        uVar1 = *(uint *)(*(long *)(ctx + 8) + 0x10 + (ulong)local_3c * 0x20);
        this = (arg_map<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                *)(ulong)uVar1;
        if (uVar1 == 0) break;
        if (uVar1 == 1) {
          puVar9 = (undefined8 *)(*(long *)(ctx + 8) + (ulong)local_3c * 0x20);
          val_00.field_0.string.size = in_stack_ffffffffffffffb8;
          val_00.field_0.long_long_value = puVar9[1];
          push_back((arg_map<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                     *)*puVar9,val_00);
        }
        local_3c = local_3c + 1;
      }
    }
  }
  return (int)this;
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context> &args) {
  if (map_)
    return;
  map_ = new entry[args.max_size()];
  if (args.is_packed()) {
    for (unsigned i = 0;/*nothing*/; ++i) {
      internal::type arg_type = args.type(i);
      switch (arg_type) {
        case internal::none_type:
          return;
        case internal::named_arg_type:
          push_back(args.values_[i]);
          break;
        default:
          break; // Do nothing.
      }
    }
  }
  for (unsigned i = 0; ; ++i) {
    switch (args.args_[i].type_) {
      case internal::none_type:
        return;
      case internal::named_arg_type:
        push_back(args.args_[i].value_);
        break;
      default:
        break; // Do nothing.
    }
  }
}